

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_block_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_21bf54d::ErrorBlockTest_DISABLED_Speed_Test::TestBody
          (ErrorBlockTest_DISABLED_Speed_Test *this)

{
  uint32_t range;
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int j;
  ulong uVar8;
  ulong uVar9;
  ACMRandom rnd;
  aom_usec_timer test_timer;
  aom_usec_timer ref_timer;
  int64_t ref_ssz;
  int64_t ssz;
  tran_low_t coeff [4096];
  tran_low_t dqcoeff [4096];
  uint local_80a0;
  Random local_8094;
  ulong local_8090;
  timeval local_8088;
  timeval local_8078;
  timeval local_8068;
  timeval local_8058;
  int64_t local_8048;
  int64_t local_8040;
  uint32_t local_8038 [4096];
  uint32_t local_4038 [4098];
  
  local_8094.state_ = 0xbaba;
  range = 1 << ((char)(this->super_ErrorBlockTest).bit_depth_ + 7 & 0x1f);
  iVar4 = 0;
  do {
    uVar9 = (ulong)(uint)(0x10 << ((byte)iVar4 & 0x1f));
    local_80a0 = 0;
    do {
      uVar8 = 0;
      do {
        uVar1 = testing::internal::Random::Generate(&local_8094,2);
        if (local_80a0 < 5) {
          uVar2 = testing::internal::Random::Generate(&local_8094,range);
          if (uVar1 == 0) {
            local_8038[uVar8] = -uVar2;
            uVar1 = testing::internal::Random::Generate(&local_8094,range);
            uVar1 = -uVar1;
          }
          else {
            local_8038[uVar8] = uVar2;
            uVar1 = testing::internal::Random::Generate(&local_8094,range);
          }
        }
        else {
          uVar2 = testing::internal::Random::Generate(&local_8094,0x4000);
          if (uVar1 == 0) {
            local_8038[uVar8] = -uVar2;
            uVar1 = testing::internal::Random::Generate(&local_8094,0x4000);
            uVar1 = -uVar1;
          }
          else {
            local_8038[uVar8] = uVar2;
            uVar1 = testing::internal::Random::Generate(&local_8094,0x4000);
          }
        }
        local_4038[uVar8] = uVar1;
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
      gettimeofday(&local_8068,(__timezone_ptr_t)0x0);
      iVar7 = 100000;
      do {
        (*(this->super_ErrorBlockTest).ref_error_block_op_)
                  ((tran_low_t *)local_8038,(tran_low_t *)local_4038,uVar9,&local_8048,
                   (this->super_ErrorBlockTest).bit_depth_);
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      gettimeofday(&local_8058,(__timezone_ptr_t)0x0);
      lVar5 = local_8058.tv_usec - local_8068.tv_usec;
      lVar6 = lVar5 + 1000000;
      if (-1 < lVar5) {
        lVar6 = lVar5;
      }
      local_8090 = ((lVar5 >> 0x3f) + (local_8058.tv_sec - local_8068.tv_sec)) * 1000000 + lVar6;
      gettimeofday(&local_8088,(__timezone_ptr_t)0x0);
      iVar7 = 100000;
      do {
        (*(this->super_ErrorBlockTest).error_block_op_)
                  ((tran_low_t *)local_8038,(tran_low_t *)local_4038,uVar9,&local_8040,
                   (this->super_ErrorBlockTest).bit_depth_);
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
      gettimeofday(&local_8078,(__timezone_ptr_t)0x0);
      lVar6 = local_8078.tv_usec - local_8088.tv_usec;
      iVar7 = (int)lVar6 + 1000000;
      if (-1 < lVar6) {
        iVar7 = (int)lVar6;
      }
      uVar3 = iVar7 + ((int)(lVar6 >> 0x3f) + ((int)local_8078.tv_sec - (int)local_8088.tv_sec)) *
                      1000000;
      printf(" c_time=%d \t simd_time=%d \t gain=%d \n",local_8090,(ulong)uVar3,
             (long)((ulong)(uint)((int)local_8090 >> 0x1f) << 0x20 | local_8090 & 0xffffffff) /
             (long)(int)uVar3 & 0xffffffff);
      local_80a0 = local_80a0 + 1;
    } while (local_80a0 != 9);
    iVar4 = iVar4 + 1;
  } while (iVar4 != 9);
  return;
}

Assistant:

TEST_P(ErrorBlockTest, DISABLED_Speed) {
  ACMRandom rnd(ACMRandom::DeterministicSeed());
  DECLARE_ALIGNED(16, tran_low_t, coeff[4096]);
  DECLARE_ALIGNED(16, tran_low_t, dqcoeff[4096]);
  intptr_t block_size;
  int64_t ssz;
  int num_iters = 100000;
  int64_t ref_ssz;
  const int msb = bit_depth_ + 8 - 1;
  for (int i = 0; i < 9; ++i) {
    block_size = 16 << (i % 9);  // All block sizes from 4x4, 8x4 ..64x64
    for (int k = 0; k < 9; k++) {
      for (int j = 0; j < block_size; j++) {
        if (k < 5) {
          if (rnd(2)) {
            // Positive number
            coeff[j] = rnd(1 << msb);
            dqcoeff[j] = rnd(1 << msb);
          } else {
            // Negative number
            coeff[j] = -rnd(1 << msb);
            dqcoeff[j] = -rnd(1 << msb);
          }
        } else {
          if (rnd(2)) {
            // Positive number
            coeff[j] = rnd(1 << 14);
            dqcoeff[j] = rnd(1 << 14);
          } else {
            // Negative number
            coeff[j] = -rnd(1 << 14);
            dqcoeff[j] = -rnd(1 << 14);
          }
        }
      }
      aom_usec_timer ref_timer, test_timer;

      aom_usec_timer_start(&ref_timer);
      for (int iter = 0; iter < num_iters; ++iter) {
        ref_error_block_op_(coeff, dqcoeff, block_size, &ref_ssz, bit_depth_);
      }
      aom_usec_timer_mark(&ref_timer);
      const int elapsed_time_c =
          static_cast<int>(aom_usec_timer_elapsed(&ref_timer));

      aom_usec_timer_start(&test_timer);
      for (int iter = 0; iter < num_iters; ++iter) {
        error_block_op_(coeff, dqcoeff, block_size, &ssz, bit_depth_);
      }
      aom_usec_timer_mark(&test_timer);

      const int elapsed_time_simd =
          static_cast<int>(aom_usec_timer_elapsed(&test_timer));

      printf(
          " c_time=%d \t simd_time=%d \t "
          "gain=%d \n",
          elapsed_time_c, elapsed_time_simd,
          (elapsed_time_c / elapsed_time_simd));
    }
  }
}